

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

t_operand __thiscall
xemmai::ast::t_throw::f_emit(t_throw *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  pointer ptVar1;
  t_emit *this_00;
  t_operand tVar2;
  bool a_clear_local;
  bool a_operand_local;
  bool a_tail_local;
  t_emit *a_emit_local;
  t_throw *this_local;
  anon_union_8_4_0f1077ea_for_t_operand_2 local_10;
  
  ptVar1 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
           operator->(&this->v_expression);
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0);
  t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
  t_emit::f_pop(a_emit);
  this_00 = t_emit::operator<<(a_emit,c_instruction__THROW);
  t_emit::operator<<(this_00,a_emit->v_stack);
  if (!a_clear) {
    t_emit::f_push(a_emit);
  }
  t_emit::f_at(a_emit,&this->super_t_node);
  t_operand::t_operand((t_operand *)&this_local);
  tVar2._4_4_ = 0;
  tVar2.v_tag = (uint)this_local;
  tVar2.field_1.v_integer = local_10.v_integer;
  return tVar2;
}

Assistant:

t_operand t_throw::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	v_expression->f_emit(a_emit, false, false);
	a_emit.f_emit_safe_point(this);
	a_emit.f_pop();
	a_emit << c_instruction__THROW << a_emit.v_stack;
	if (!a_clear) a_emit.f_push();
	a_emit.f_at(this);
	return {};
}